

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btUniformScalingShape.cpp
# Opt level: O3

void __thiscall
btUniformScalingShape::getAabbSlow
          (btUniformScalingShape *this,btTransform *t,btVector3 *aabbMin,btVector3 *aabbMax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  long lVar19;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar20;
  float fVar21;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118 [8];
  undefined8 uStack_110;
  float local_108 [2];
  undefined1 auStack_100 [12];
  undefined4 local_f4;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  undefined8 local_d4;
  undefined8 uStack_cc;
  undefined4 local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  float local_a8 [28];
  float local_38;
  
  local_108[0] = 1.0;
  stack0xfffffffffffffefc = 0;
  auStack_100._4_8_ = 0;
  local_f4 = 0x3f800000;
  local_f0 = 0;
  uStack_e8 = 0;
  local_e0 = 0x3f800000;
  local_d8 = 0xbf800000;
  local_d4 = 0;
  uStack_cc = 0;
  local_c4 = 0xbf800000;
  local_c0 = 0;
  uStack_b8 = 0;
  local_b0 = 0xbf800000;
  local_a8[0x14] = 0.0;
  local_a8[0x15] = 0.0;
  local_a8[0x16] = 0.0;
  local_a8[0x17] = 0.0;
  local_a8[0x10] = 0.0;
  local_a8[0x11] = 0.0;
  local_a8[0x12] = 0.0;
  local_a8[0x13] = 0.0;
  local_a8[0xc] = 0.0;
  local_a8[0xd] = 0.0;
  local_a8[0xe] = 0.0;
  local_a8[0xf] = 0.0;
  local_a8[8] = 0.0;
  local_a8[9] = 0.0;
  local_a8[10] = 0.0;
  local_a8[0xb] = 0.0;
  local_a8[4] = 0.0;
  local_a8[5] = 0.0;
  local_a8[6] = 0.0;
  local_a8[7] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  local_a8[3] = 0.0;
  uVar11 = *(undefined8 *)(t->m_basis).m_el[0].m_floats;
  uVar12 = *(undefined8 *)(t->m_basis).m_el[1].m_floats;
  uVar13 = *(undefined8 *)(t->m_basis).m_el[2].m_floats;
  fVar1 = (t->m_basis).m_el[0].m_floats[2];
  fVar2 = (t->m_basis).m_el[1].m_floats[2];
  fVar3 = (t->m_basis).m_el[2].m_floats[2];
  lVar19 = 8;
  do {
    fVar4 = *(float *)(local_118 + lVar19 + 8);
    fVar5 = *(float *)(local_118 + lVar19 + 0xc);
    fVar6 = *(float *)((long)local_108 + lVar19);
    *(ulong *)(local_118 + lVar19 + 8) =
         CONCAT44(fVar6 * (float)((ulong)uVar13 >> 0x20) +
                  fVar4 * (float)((ulong)uVar11 >> 0x20) + fVar5 * (float)((ulong)uVar12 >> 0x20),
                  fVar6 * (float)uVar13 + fVar4 * (float)uVar11 + fVar5 * (float)uVar12);
    *(ulong *)((long)local_108 + lVar19) =
         (ulong)(uint)(fVar5 * fVar2 + fVar1 * fVar4 + fVar3 * fVar6);
    lVar19 = lVar19 + 0x10;
  } while (lVar19 != 0x68);
  (*(this->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0x13])
            (this,local_108,local_a8,6);
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  fVar16 = (t->m_basis).m_el[0].m_floats[0];
  fVar17 = (t->m_basis).m_el[0].m_floats[1];
  fVar18 = (t->m_basis).m_el[0].m_floats[2];
  fVar1 = (t->m_basis).m_el[2].m_floats[0];
  fVar2 = (t->m_basis).m_el[2].m_floats[1];
  fVar3 = (t->m_basis).m_el[2].m_floats[2];
  uVar11 = *(undefined8 *)(t->m_origin).m_floats;
  fVar4 = (t->m_origin).m_floats[2];
  fVar5 = (t->m_basis).m_el[1].m_floats[2];
  fVar6 = (t->m_basis).m_el[1].m_floats[0];
  fVar7 = (t->m_basis).m_el[1].m_floats[1];
  lVar19 = 0;
  do {
    fVar8 = local_a8[lVar19];
    fVar9 = local_a8[lVar19 + 1];
    fVar10 = local_a8[lVar19 + 2];
    fVar20 = (float)uVar11;
    fVar21 = (float)((ulong)uVar11 >> 0x20);
    local_118._4_4_ = fVar10 * fVar5 + fVar8 * fVar6 + fVar9 * fVar7 + fVar21;
    local_118._0_4_ = fVar10 * fVar18 + fVar8 * fVar16 + fVar9 * fVar17 + fVar20;
    unique0x100002fc = fVar10 * fVar3 + fVar8 * fVar1 + fVar9 * fVar2 + fVar4;
    unique0x10000300 = 0;
    *(undefined4 *)((long)&local_138 + lVar19) = *(undefined4 *)(local_118 + lVar19);
    fVar8 = local_a8[lVar19 + 0xc];
    fVar9 = local_a8[lVar19 + 0xd];
    fVar10 = local_a8[lVar19 + 0xe];
    local_118._4_4_ = fVar10 * fVar5 + fVar8 * fVar6 + fVar9 * fVar7 + fVar21;
    local_118._0_4_ = fVar10 * fVar18 + fVar8 * fVar16 + fVar9 * fVar17 + fVar20;
    unique0x10000320 = fVar10 * fVar3 + fVar8 * fVar1 + fVar2 * fVar9 + fVar4;
    unique0x10000324 = 0;
    *(undefined4 *)((long)&local_128 + lVar19) = *(undefined4 *)(local_118 + lVar19);
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0xc);
  (*(this->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  local_38 = extraout_XMM0_Da;
  (*(this->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  local_a8[0x18] = extraout_XMM0_Da_00;
  (*(this->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  auVar14._4_4_ = (float)((ulong)local_128 >> 0x20) - local_a8[0x18];
  auVar14._0_4_ = (float)local_128 - local_38;
  auVar14._8_4_ = (float)uStack_120 - extraout_XMM0_Da_01;
  auVar14._12_4_ = 0;
  *(undefined1 (*) [16])aabbMin->m_floats = auVar14;
  auVar15._4_4_ = (float)((ulong)local_138 >> 0x20) + local_a8[0x18];
  auVar15._0_4_ = (float)local_138 + local_38;
  auVar15._8_4_ = extraout_XMM0_Da_01 + (float)uStack_130;
  auVar15._12_4_ = 0;
  *(undefined1 (*) [16])aabbMax->m_floats = auVar15;
  return;
}

Assistant:

void btUniformScalingShape::getAabbSlow(const btTransform& t,btVector3& aabbMin,btVector3& aabbMax) const
{
#if 1
	btVector3 _directions[] =
	{
		btVector3( 1.,  0.,  0.),
		btVector3( 0.,  1.,  0.),
		btVector3( 0.,  0.,  1.),
		btVector3( -1., 0.,  0.),
		btVector3( 0., -1.,  0.),
		btVector3( 0.,  0., -1.)
	};
	
	btVector3 _supporting[] =
	{
		btVector3( 0., 0., 0.),
		btVector3( 0., 0., 0.),
		btVector3( 0., 0., 0.),
		btVector3( 0., 0., 0.),
		btVector3( 0., 0., 0.),
		btVector3( 0., 0., 0.)
	};

	for (int i=0;i<6;i++)
	{
		_directions[i] = _directions[i]*t.getBasis();
	}
	
	batchedUnitVectorGetSupportingVertexWithoutMargin(_directions, _supporting, 6);
	
	btVector3 aabbMin1(0,0,0),aabbMax1(0,0,0);

	for ( int i = 0; i < 3; ++i )
	{
		aabbMax1[i] = t(_supporting[i])[i];
		aabbMin1[i] = t(_supporting[i + 3])[i];
	}
	btVector3 marginVec(getMargin(),getMargin(),getMargin());
	aabbMin = aabbMin1-marginVec;
	aabbMax = aabbMax1+marginVec;
	
#else

	btScalar margin = getMargin();
	for (int i=0;i<3;i++)
	{
		btVector3 vec(btScalar(0.),btScalar(0.),btScalar(0.));
		vec[i] = btScalar(1.);
		btVector3 sv = localGetSupportingVertex(vec*t.getBasis());
		btVector3 tmp = t(sv);
		aabbMax[i] = tmp[i]+margin;
		vec[i] = btScalar(-1.);
		sv = localGetSupportingVertex(vec*t.getBasis());
		tmp = t(sv);
		aabbMin[i] = tmp[i]-margin;
	}

#endif
}